

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_pool_1d(ggml_context *ctx,ggml_tensor *a,ggml_op_pool op,int k0,int s0,int p0)

{
  ggml_tensor *pgVar1;
  long local_48;
  int64_t local_40;
  int64_t iStack_38;
  int64_t local_30;
  
  local_48 = (long)((((float)p0 + (float)p0 + (float)a->ne[0]) - (float)k0) / (float)s0 + 1.0);
  local_40 = a->ne[1];
  iStack_38 = a->ne[2];
  local_30 = a->ne[3];
  pgVar1 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,&local_48,(ggml_tensor *)0x0,0);
  if (pgVar1 != (ggml_tensor *)0x0) {
    pgVar1->op_params[0] = op;
    pgVar1->op_params[1] = k0;
    pgVar1->op_params[2] = s0;
    pgVar1->op_params[3] = p0;
    pgVar1->op = GGML_OP_POOL_1D;
    pgVar1->src[0] = a;
    return pgVar1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-impl.h",
             0x70,"GGML_ASSERT(%s) failed","tensor != NULL");
}

Assistant:

struct ggml_tensor * ggml_pool_1d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        enum ggml_op_pool     op,
        int                   k0,
        int                   s0,
        int                   p0) {
    const int64_t ne[4] = {
        ggml_calc_pool_output_size(a->ne[0], k0, s0, p0),
        a->ne[1],
        a->ne[2],
        a->ne[3],
    };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    int32_t params[] = { op, k0, s0, p0 };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_POOL_1D;
    result->src[0] = a;

    return result;
}